

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O1

DisasJumpType op_vac(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  DisasJumpType DVar2;
  
  uVar1 = (s->fields).presentO;
  if ((uVar1 & 0x40) != 0) {
    if ((s->fields).c[4] == 4) {
      if (((((uVar1 >> 0x16 & 1) == 0) || ((uVar1 >> 0x17 & 1) == 0)) || ((uVar1 >> 0x18 & 1) == 0))
         || ((uVar1 >> 0x19 & 1) == 0)) goto LAB_00cd800e;
      gen_gvec128_4_i64(s->uc->tcg_ctx,gen_ac2_i64,(uint8_t)(s->fields).c[0],
                        (uint8_t)(s->fields).c[6],(uint8_t)(s->fields).c[2],
                        (uint8_t)(s->fields).c[3]);
      DVar2 = DISAS_NEXT;
    }
    else {
      gen_program_exception(s,6);
      DVar2 = DISAS_NORETURN;
    }
    return DVar2;
  }
LAB_00cd800e:
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vac(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (get_field(s, m5) != ES_128) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    gen_gvec128_4_i64(tcg_ctx, gen_ac2_i64, get_field(s, v1),
                      get_field(s, v2), get_field(s, v3),
                      get_field(s, v4));
    return DISAS_NEXT;
}